

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O0

Ch __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::PercentDecodeStream::Take(PercentDecodeStream *this)

{
  char cVar1;
  char cVar2;
  int local_20;
  Ch h;
  int j;
  Ch c;
  PercentDecodeStream *this_local;
  
  if ((*this->src_ == '%') && (this->src_ + 3 <= this->end_)) {
    this->src_ = this->src_ + 1;
    h = '\0';
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      cVar2 = h * '\x10';
      cVar1 = *this->src_;
      if ((cVar1 < '0') || ('9' < cVar1)) {
        if ((cVar1 < 'A') || ('F' < cVar1)) {
          if ((cVar1 < 'a') || ('f' < cVar1)) {
            this->valid_ = false;
            return '\0';
          }
          h = cVar2 + cVar1 + -0x57;
        }
        else {
          h = cVar2 + cVar1 + -0x37;
        }
      }
      else {
        h = cVar2 + cVar1 + -0x30;
      }
      this->src_ = this->src_ + 1;
    }
    this_local._7_1_ = h;
  }
  else {
    this->valid_ = false;
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

Ch Take() {
            if (*src_ != '%' || src_ + 3 > end_) { // %XY triplet
                valid_ = false;
                return 0;
            }
            src_++;
            Ch c = 0;
            for (int j = 0; j < 2; j++) {
                c = static_cast<Ch>(c << 4);
                Ch h = *src_;
                if      (h >= '0' && h <= '9') c = static_cast<Ch>(c + h - '0');
                else if (h >= 'A' && h <= 'F') c = static_cast<Ch>(c + h - 'A' + 10);
                else if (h >= 'a' && h <= 'f') c = static_cast<Ch>(c + h - 'a' + 10);
                else {
                    valid_ = false;
                    return 0;
                }
                src_++;
            }
            return c;
        }